

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O1

char * common_chat_templates_source(common_chat_templates *tmpls,char *variant)

{
  int iVar1;
  common_log *log;
  chat_template *pcVar2;
  
  if (variant != (char *)0x0) {
    iVar1 = strcmp(variant,"tool_use");
    if (iVar1 == 0) {
      pcVar2 = (tmpls->template_tool_use)._M_t.
               super___uniq_ptr_impl<minja::chat_template,_std::default_delete<minja::chat_template>_>
               ._M_t.
               super__Tuple_impl<0UL,_minja::chat_template_*,_std::default_delete<minja::chat_template>_>
               .super__Head_base<0UL,_minja::chat_template_*,_false>._M_head_impl;
      if (pcVar2 == (chat_template *)0x0) {
        return (char *)0x0;
      }
      goto LAB_001983fb;
    }
    if (0 < common_log_verbosity_thold) {
      log = common_log_main();
      common_log_add(log,GGML_LOG_LEVEL_DEBUG,"%s: unknown template variant: %s\n",
                     "common_chat_templates_source",variant);
    }
  }
  pcVar2 = (tmpls->template_default)._M_t.
           super___uniq_ptr_impl<minja::chat_template,_std::default_delete<minja::chat_template>_>.
           _M_t.
           super__Tuple_impl<0UL,_minja::chat_template_*,_std::default_delete<minja::chat_template>_>
           .super__Head_base<0UL,_minja::chat_template_*,_false>._M_head_impl;
LAB_001983fb:
  return (pcVar2->source_)._M_dataplus._M_p;
}

Assistant:

const char * common_chat_templates_source(const struct common_chat_templates * tmpls, const char * variant) {
    if (variant != nullptr) {
        if (strcmp(variant, "tool_use") == 0) {
            if (tmpls->template_tool_use) {
                return tmpls->template_tool_use->source().c_str();
            }
            return nullptr;
        } else {
            LOG_DBG("%s: unknown template variant: %s\n", __func__, variant);
        }
    }
    return tmpls->template_default->source().c_str();
}